

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.h
# Opt level: O0

bool cmCPackDebGenerator::CanGenerate(void)

{
  return true;
}

Assistant:

static bool CanGenerate()
  {
#ifdef __APPLE__
    // on MacOS enable CPackDeb iff dpkg is found
    std::vector<std::string> locations;
    locations.emplace_back("/sw/bin");        // Fink
    locations.emplace_back("/opt/local/bin"); // MacPorts
    return !cmSystemTools::FindProgram("dpkg", locations).empty();
#else
    // legacy behavior on other systems
    return true;
#endif
  }